

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

roaring64_bitmap_t * roaring64_bitmap_flip_closed(roaring64_bitmap_t *r1,uint64_t min,uint64_t max)

{
  uint8_t uVar1;
  int iVar2;
  ulong in_RDX;
  ulong in_RSI;
  leaf_t leaf2_1;
  container_t *container2_1;
  uint8_t typecode2_1;
  leaf_t leaf1_1;
  uint32_t max_container;
  uint32_t min_container;
  uint8_t current_high48_key [6];
  uint64_t high48_bits;
  leaf_t leaf2;
  container_t *container2;
  uint8_t typecode2;
  leaf_t leaf1;
  art_iterator_t it;
  roaring64_bitmap_t *r2;
  uint64_t max_high48_bits;
  uint64_t min_high48_bits;
  uint16_t max_low16;
  uint8_t max_high48_key [6];
  uint16_t min_low16;
  uint8_t min_high48_key [6];
  uint7 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3f;
  undefined1 uVar3;
  roaring64_bitmap_t *in_stack_fffffffffffffe40;
  uint8_t typecode;
  art_t *in_stack_fffffffffffffe48;
  undefined1 copy_on_write;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  container_t *in_stack_fffffffffffffe58;
  container_t *c;
  undefined1 local_1a0 [8];
  uint32_t in_stack_fffffffffffffe68;
  uint32_t in_stack_fffffffffffffe6c;
  uint8_t *in_stack_fffffffffffffe70;
  roaring64_bitmap_t *in_stack_fffffffffffffe78;
  roaring64_bitmap_t *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  ulong local_100;
  undefined1 local_d8 [8];
  leaf_t *local_d0;
  roaring64_bitmap_t *local_48;
  ulong local_40;
  ulong local_38;
  uint16_t local_30;
  uint16_t local_28;
  ulong local_20;
  ulong local_18;
  roaring64_bitmap_t *local_8;
  
  if (in_RDX < in_RSI) {
    local_8 = roaring64_bitmap_copy
                        ((roaring64_bitmap_t *)
                         CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  }
  else {
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_28 = split_key((uint64_t)in_stack_fffffffffffffe40,
                         (uint8_t *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
    local_30 = split_key((uint64_t)in_stack_fffffffffffffe40,
                         (uint8_t *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
    local_38 = local_18 >> 0x10;
    local_40 = local_20 >> 0x10;
    local_48 = roaring64_bitmap_create();
    art_init_iterator((art_t *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                      SUB81((ulong)in_stack_fffffffffffffe48 >> 0x38,0));
    while( true ) {
      uVar3 = false;
      if (local_d0 != (leaf_t *)0x0) {
        iVar2 = compare_high48((art_key_chunk_t *)in_stack_fffffffffffffe40,
                               (art_key_chunk_t *)(ulong)in_stack_fffffffffffffe38);
        uVar3 = iVar2 < 0;
      }
      if ((bool)uVar3 == false) break;
      get_typecode(*local_d0);
      get_container(in_stack_fffffffffffffe40,CONCAT17(uVar3,in_stack_fffffffffffffe38));
      get_copy_of_container
                (in_stack_fffffffffffffe58,
                 (uint8_t *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                 SUB81((ulong)in_stack_fffffffffffffe48 >> 0x38,0));
      add_container((roaring64_bitmap_t *)
                    CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                    in_stack_fffffffffffffe48,(uint8_t)((ulong)in_stack_fffffffffffffe40 >> 0x38));
      art_insert(in_stack_fffffffffffffe48,(art_key_chunk_t *)in_stack_fffffffffffffe40,
                 CONCAT17(uVar3,in_stack_fffffffffffffe38));
      art_iterator_next((art_iterator_t *)0x140e32);
    }
    uVar3 = 0;
    for (local_100 = local_38; local_100 <= local_40; local_100 = local_100 + 1) {
      split_key((uint64_t)in_stack_fffffffffffffe40,
                (uint8_t *)CONCAT17(uVar3,in_stack_fffffffffffffe38));
      roaring64_flip_leaf(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                          in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,
                          in_stack_fffffffffffffe68);
    }
    art_upper_bound((art_t *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                    (art_key_chunk_t *)in_stack_fffffffffffffe48);
    memcpy(local_d8,local_1a0,0x90);
    while (copy_on_write = (undefined1)((ulong)in_stack_fffffffffffffe48 >> 0x38),
          local_d0 != (leaf_t *)0x0) {
      c = (container_t *)*local_d0;
      uVar1 = get_typecode((leaf_t)c);
      get_container(in_stack_fffffffffffffe40,CONCAT17(uVar3,in_stack_fffffffffffffe38));
      typecode = (uint8_t)((ulong)in_stack_fffffffffffffe40 >> 0x38);
      in_stack_fffffffffffffe48 =
           (art_t *)get_copy_of_container
                              (c,(uint8_t *)CONCAT17(uVar1,in_stack_fffffffffffffe50),
                               (_Bool)copy_on_write);
      in_stack_fffffffffffffe40 =
           (roaring64_bitmap_t *)
           add_container((roaring64_bitmap_t *)CONCAT17(uVar1,in_stack_fffffffffffffe50),
                         in_stack_fffffffffffffe48,typecode);
      art_insert(in_stack_fffffffffffffe48,(art_key_chunk_t *)in_stack_fffffffffffffe40,
                 CONCAT17(uVar3,in_stack_fffffffffffffe38));
      art_iterator_next((art_iterator_t *)0x140fdd);
    }
    local_8 = local_48;
  }
  return local_8;
}

Assistant:

roaring64_bitmap_t *roaring64_bitmap_flip_closed(const roaring64_bitmap_t *r1,
                                                 uint64_t min, uint64_t max) {
    if (min > max) {
        return roaring64_bitmap_copy(r1);
    }
    uint8_t min_high48_key[ART_KEY_BYTES];
    uint16_t min_low16 = split_key(min, min_high48_key);
    uint8_t max_high48_key[ART_KEY_BYTES];
    uint16_t max_low16 = split_key(max, max_high48_key);
    uint64_t min_high48_bits = (min & 0xFFFFFFFFFFFF0000ULL) >> 16;
    uint64_t max_high48_bits = (max & 0xFFFFFFFFFFFF0000ULL) >> 16;

    roaring64_bitmap_t *r2 = roaring64_bitmap_create();
    art_iterator_t it = art_init_iterator((art_t *)&r1->art, /*first=*/true);

    // Copy the containers before min unchanged.
    while (it.value != NULL && compare_high48(it.key, min_high48_key) < 0) {
        leaf_t leaf1 = (leaf_t)*it.value;
        uint8_t typecode2 = get_typecode(leaf1);
        container_t *container2 = get_copy_of_container(
            get_container(r1, leaf1), &typecode2, /*copy_on_write=*/false);
        leaf_t leaf2 = add_container(r2, container2, typecode2);
        art_insert(&r2->art, it.key, (art_val_t)leaf2);
        art_iterator_next(&it);
    }

    // Flip the range (including non-existent containers!) between min and
    // max.
    for (uint64_t high48_bits = min_high48_bits; high48_bits <= max_high48_bits;
         high48_bits++) {
        uint8_t current_high48_key[ART_KEY_BYTES];
        split_key(high48_bits << 16, current_high48_key);

        uint32_t min_container = 0;
        if (high48_bits == min_high48_bits) {
            min_container = min_low16;
        }
        uint32_t max_container = 0xFFFF + 1;  // Exclusive range.
        if (high48_bits == max_high48_bits) {
            max_container = max_low16 + 1;  // Exclusive.
        }

        roaring64_flip_leaf(r1, r2, current_high48_key, min_container,
                            max_container);
    }

    // Copy the containers after max unchanged.
    it = art_upper_bound((art_t *)&r1->art, max_high48_key);
    while (it.value != NULL) {
        leaf_t leaf1 = (leaf_t)*it.value;
        uint8_t typecode2 = get_typecode(leaf1);
        container_t *container2 = get_copy_of_container(
            get_container(r1, leaf1), &typecode2, /*copy_on_write=*/false);
        leaf_t leaf2 = add_container(r2, container2, typecode2);
        art_insert(&r2->art, it.key, (art_val_t)leaf2);
        art_iterator_next(&it);
    }

    return r2;
}